

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderBullet(ImVec2 pos)

{
  float fVar1;
  ImDrawList *this;
  ImU32 col;
  ImVec2 pos_local;
  
  this = GImGui->CurrentWindow->DrawList;
  fVar1 = GImGui->FontSize;
  pos_local = pos;
  col = GetColorU32(0,1.0);
  ImDrawList::AddCircleFilled(this,&pos_local,fVar1 * 0.2,col,8);
  return;
}

Assistant:

void ImGui::RenderBullet(ImVec2 pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddCircleFilled(pos, GImGui->FontSize*0.20f, GetColorU32(ImGuiCol_Text), 8);
}